

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryCache.cpp
# Opt level: O2

Lexeme * BinaryCache::FindLexems(char *moduleName,bool addExtension,uint *count)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  Lexeme *pLVar4;
  ulong uVar5;
  undefined7 in_register_00000031;
  uint pos;
  char path [1024];
  char local_438 [1032];
  
  pcVar2 = strstr(moduleName,".nc");
  if ((int)CONCAT71(in_register_00000031,addExtension) == 0) {
    if (pcVar2 == (char *)0x0) {
      __assert_fail("strstr(moduleName, \".nc\") != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/BinaryCache.cpp"
                    ,0xe5,"Lexeme *BinaryCache::FindLexems(const char *, bool, unsigned int &)");
    }
  }
  else if (pcVar2 != (char *)0x0) {
    __assert_fail("strstr(moduleName, \".nc\") == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/BinaryCache.cpp"
                  ,0xe3,"Lexeme *BinaryCache::FindLexems(const char *, bool, unsigned int &)");
  }
  pos = 0;
  do {
    pcVar2 = EnumImportPath(pos);
    if (pcVar2 == (char *)0x0) {
      return (Lexeme *)0x0;
    }
    iVar1 = NULLC::SafeSprintf(local_438,0x400,"%s%s",pcVar2,moduleName);
    if (addExtension) {
      sVar3 = strlen(pcVar2);
      pcVar2 = local_438 + sVar3;
      sVar3 = strlen(pcVar2);
      for (uVar5 = 0; (sVar3 & 0xffffffff) != uVar5; uVar5 = uVar5 + 1) {
        if (pcVar2[uVar5] == '.') {
          pcVar2[uVar5] = '/';
        }
      }
      NULLC::SafeSprintf(local_438 + iVar1,(ulong)(0x400 - iVar1),".nc");
    }
    pos = pos + 1;
    pLVar4 = GetLexems(local_438,count);
  } while (pLVar4 == (Lexeme *)0x0);
  return pLVar4;
}

Assistant:

Lexeme* BinaryCache::FindLexems(const char* moduleName, bool addExtension, unsigned& count)
{
	if(addExtension)
		assert(strstr(moduleName, ".nc") == 0);
	else
		assert(strstr(moduleName, ".nc") != 0);

	const unsigned pathLength = 1024;
	char path[pathLength];

	unsigned modulePathPos = 0;
	while(const char *modulePath = BinaryCache::EnumImportPath(modulePathPos++))
	{
		char *pathEnd = path + NULLC::SafeSprintf(path, pathLength, "%s%s", modulePath, moduleName);

		if(addExtension)
		{
			char *pathNoImport = path + strlen(modulePath);

			for(unsigned i = 0, e = (unsigned)strlen(pathNoImport); i != e; i++)
			{
				if(pathNoImport[i] == '.')
					pathNoImport[i] = '/';
			}

			NULLC::SafeSprintf(pathEnd, pathLength - int(pathEnd - path), ".nc");
		}

		if(Lexeme *lexems = BinaryCache::GetLexems(path, count))
			return lexems;
	}

	return NULL;
}